

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O0

bool __thiscall Am_Input_Char::Exit_If_Stop_Char(Am_Input_Char *this)

{
  bool bVar1;
  ostream *this_00;
  Am_Input_Char *this_local;
  
  bVar1 = operator==(this,Am_Stop_Character);
  if (bVar1) {
    this_00 = std::operator<<((ostream *)&std::cerr,"Got stop event: exiting Amulet main loop.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return bVar1;
}

Assistant:

bool
Am_Input_Char::Exit_If_Stop_Char() const
{
  if (*this == Am_Stop_Character) {
    std::cerr << "Got stop event: exiting Amulet main loop." << std::endl;
    //    Am_Main_Loop_Go = false;
    return true;
  } else
    return false;
}